

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tpzdohrsubstruct.cpp
# Opt level: O2

void __thiscall
TPZDohrSubstruct<float>::ContributeResidual
          (TPZDohrSubstruct<float> *this,TPZFMatrix<float> *u,TPZFMatrix<float> *r)

{
  float fVar1;
  uint uVar2;
  int iVar3;
  pair<int,_int> *ppVar4;
  TPZMatrix<float> *pTVar5;
  float *pfVar6;
  ulong uVar7;
  ulong uVar8;
  TPZFMatrix<float> reslocal;
  TPZFMatrix<float> ulocal;
  
  reslocal.super_TPZMatrix<float>.super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable._0_4_ = 0;
  TPZFMatrix<float>::TPZFMatrix(&ulocal,(long)this->fNEquations,1,(float *)&reslocal);
  TPZFMatrix<float>::TPZFMatrix(&reslocal,(long)this->fNEquations,1);
  uVar2 = (uint)(this->fGlobalEqs).fNElements;
  uVar7 = 0;
  uVar8 = (ulong)uVar2;
  if ((int)uVar2 < 1) {
    uVar8 = uVar7;
  }
  for (; uVar8 != uVar7; uVar7 = uVar7 + 1) {
    ppVar4 = (this->fGlobalEqs).fStore;
    iVar3 = ppVar4[uVar7].first;
    pfVar6 = TPZFMatrix<float>::operator()(u,(long)ppVar4[uVar7].second,0);
    fVar1 = *pfVar6;
    pfVar6 = TPZFMatrix<float>::operator()(&ulocal,(long)iVar3,0);
    *pfVar6 = fVar1;
  }
  pTVar5 = ((this->fStiffness).fRef)->fPointer;
  (*(pTVar5->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x28])
            (pTVar5,&ulocal,&this->fLocalLoad,&reslocal);
  for (uVar7 = 0; uVar8 != uVar7; uVar7 = uVar7 + 1) {
    ppVar4 = (this->fGlobalEqs).fStore;
    iVar3 = ppVar4[uVar7].second;
    pfVar6 = TPZFMatrix<float>::operator()(&reslocal,(long)ppVar4[uVar7].first,0);
    fVar1 = *pfVar6;
    pfVar6 = TPZFMatrix<float>::operator()(r,(long)iVar3,0);
    *pfVar6 = fVar1 + *pfVar6;
  }
  TPZFMatrix<float>::~TPZFMatrix(&reslocal);
  TPZFMatrix<float>::~TPZFMatrix(&ulocal);
  return;
}

Assistant:

void TPZDohrSubstruct<TVar>::ContributeResidual(TPZFMatrix<TVar> &u, TPZFMatrix<TVar> &r){
	TPZFMatrix<TVar> ulocal(fNEquations,1,0.);
	TPZFMatrix<TVar> reslocal(fNEquations,1);
	int i;
	int neqs = fGlobalEqs.NElements();
	for (i=0;i<neqs;i++) 
	{
		std::pair<int,int> ind = fGlobalEqs[i];
		ulocal(ind.first,0) = u(ind.second,0);
	}
	fStiffness->Residual(ulocal, fLocalLoad, reslocal);
	for (i=0;i<neqs;i++) {
		std::pair<int,int> ind = fGlobalEqs[i];
		r(ind.second,0) += reslocal(ind.first,0);
	}
}